

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::operator*(mat3 *__return_storage_ptr__,float_t s,mat3 *m)

{
  float_t fVar1;
  vec3 *pvVar2;
  vec3 vVar3;
  vec3 local_78;
  vec3 local_64;
  vec3 local_58;
  vec3 local_48;
  vec3 local_38;
  vec3 local_28;
  mat3 *local_18;
  mat3 *m_local;
  float_t s_local;
  
  local_18 = m;
  m_local._4_4_ = s;
  pvVar2 = mat3::operator[](m,0);
  vVar3 = operator*(s,pvVar2);
  fVar1 = m_local._4_4_;
  local_38.z = vVar3.z;
  local_28.z = local_38.z;
  local_38._0_8_ = vVar3._0_8_;
  local_28.x = local_38.x;
  local_28.y = local_38.y;
  local_38 = vVar3;
  pvVar2 = mat3::operator[](local_18,1);
  vVar3 = operator*(fVar1,pvVar2);
  fVar1 = m_local._4_4_;
  local_58.z = vVar3.z;
  local_48.z = local_58.z;
  local_58._0_8_ = vVar3._0_8_;
  local_48.x = local_58.x;
  local_48.y = local_58.y;
  local_58 = vVar3;
  pvVar2 = mat3::operator[](local_18,2);
  vVar3 = operator*(fVar1,pvVar2);
  local_78._0_8_ = vVar3._0_8_;
  local_64.x = local_78.x;
  local_64.y = local_78.y;
  local_78.z = vVar3.z;
  local_64.z = local_78.z;
  mat3::mat3(__return_storage_ptr__,&local_28,&local_48,&local_64);
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const float_t s, const mat3& m)
{
    return mat3(s * m[0], s * m[1], s * m[2]);
}